

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_auto_possess.c
# Opt level: O2

BOOL compare_opcodes(PCRE2_SPTR8 code,BOOL utf,BOOL ucp,compile_block_8 *cb,uint32_t *base_list,
                    PCRE2_SPTR8 base_end,int *rec_limit)

{
  uint8_t **ppuVar1;
  byte *pbVar2;
  byte bVar3;
  int iVar4;
  bool bVar5;
  bool bVar6;
  ushort uVar7;
  uint uVar8;
  BOOL BVar9;
  ulong uVar10;
  uint32_t *puVar11;
  uint32_t *puVar12;
  long lVar13;
  compile_block_8 *fcc;
  compile_block_8 *pcVar14;
  long lVar15;
  undefined4 in_register_00000014;
  long lVar16;
  compile_block_8 *pcVar17;
  uint8_t **ppuVar18;
  uint8_t **ppuVar19;
  uint uVar20;
  uint uVar21;
  byte *pbVar22;
  undefined4 in_stack_ffffffffffffff88;
  uint32_t list [8];
  
  lVar16 = CONCAT44(in_register_00000014,ucp);
  iVar4 = *(int *)base_end;
  uVar8 = iVar4 - 1;
  fcc = (compile_block_8 *)(ulong)uVar8;
  *(uint *)base_end = uVar8;
  bVar6 = false;
  if (iVar4 < 2) {
    return 0;
  }
  ppuVar1 = &cb->lcc;
  pcVar17 = (compile_block_8 *)base_list;
  do {
LAB_001772c6:
    while( true ) {
      while( true ) {
        for (; bVar3 = (byte)*(uint32_t *)code, bVar3 == 0x76; code = (PCRE2_SPTR8)((long)code + 6))
        {
        }
        puVar11 = (uint32_t *)code;
        if (bVar3 != 0x77) break;
        code = (PCRE2_SPTR8)
               ((long)code +
               (ulong)(ushort)(*(ushort *)((long)code + 5) << 8 | *(ushort *)((long)code + 5) >> 8))
        ;
      }
      while (bVar3 == 0x78) {
        fcc = (compile_block_8 *)
              (ulong)(ushort)(*(ushort *)((long)puVar11 + 1) << 8 |
                             *(ushort *)((long)puVar11 + 1) >> 8);
        bVar3 = *(byte *)((long)puVar11 + (long)fcc);
        puVar11 = (uint32_t *)((long)puVar11 + (long)fcc);
      }
      uVar8 = bVar3 - 0x79;
      if (uVar8 < 0x20) break;
LAB_00177410:
      if (bVar3 == 0) {
        return (uint)(*(int *)((long)&cb->cx + 4) != 0);
      }
      code = get_chr_property_list
                       ((PCRE2_SPTR8)puVar11,(BOOL)*(undefined8 *)(lVar16 + 0x10),
                        (BOOL)(compile_block_8 *)list,(uint8_t *)fcc,(uint32_t *)pcVar17);
      if ((uint32_t *)code == (uint32_t *)0x0) {
        return 0;
      }
      uVar8 = *(uint *)&cb->cx;
      if (uVar8 == 0x1d) {
        pcVar17 = (compile_block_8 *)list;
        ppuVar18 = (uint8_t **)(list + 2);
        ppuVar19 = ppuVar1;
        uVar8 = list[0];
LAB_00177471:
        fcc = (compile_block_8 *)(ulong)uVar8;
        puVar11 = (uint32_t *)code;
        if (pcVar17 != (compile_block_8 *)list) {
          puVar11 = base_list;
        }
        if (((0x1f < uVar8) || ((0xa3be0fc0U >> (uVar8 & 0x1f) & 1) == 0)) && (1 < uVar8 - 0x6e)) {
          return 0;
        }
        uVar20 = *(uint *)ppuVar19;
        pcVar17 = (compile_block_8 *)((long)ppuVar18 + 4);
        do {
          if (0x19 < uVar8 - 6) {
            if (uVar8 != 0x6f) goto switchD_001774af_caseD_c;
            if (0xff < uVar20) {
              return 0;
            }
LAB_00177505:
            bVar3 = *(byte *)((long)puVar11 + ((ulong)(uVar20 >> 3) - (ulong)*(uint *)ppuVar18)) >>
                    (uVar20 & 7) & 1;
joined_r0x00177520:
            if (bVar3 != 0) {
              return 0;
            }
            goto switchD_001774af_caseD_18;
          }
          uVar10 = (ulong)uVar20;
          switch(uVar8) {
          case 6:
            if (0xff < uVar20) {
              return 0;
            }
            bVar3 = *(byte *)(*(long *)(lVar16 + 0x20) + uVar10) & 8;
            goto joined_r0x001775a7;
          case 7:
            if (uVar20 < 0x100) {
              bVar3 = *(byte *)(*(long *)(lVar16 + 0x20) + uVar10) & 8;
joined_r0x00177563:
              if (bVar3 != 0) {
                return 0;
              }
            }
            break;
          case 8:
            if (0xff < uVar20) {
              return 0;
            }
            bVar3 = *(byte *)(*(long *)(lVar16 + 0x20) + uVar10) & 1;
            goto joined_r0x001775a7;
          case 9:
            if (uVar20 < 0x100) {
              bVar3 = *(byte *)(*(long *)(lVar16 + 0x20) + uVar10) & 1;
              goto joined_r0x00177563;
            }
            break;
          case 10:
            if (0xff < uVar20) {
              return 0;
            }
            bVar3 = *(byte *)(*(long *)(lVar16 + 0x20) + uVar10) & 0x10;
joined_r0x001775a7:
            if (bVar3 == 0) {
              return 0;
            }
            break;
          case 0xb:
            if (uVar20 < 0xff) {
              bVar3 = *(byte *)(*(long *)(lVar16 + 0x20) + uVar10) & 0x10;
              goto joined_r0x00177520;
            }
            break;
          default:
switchD_001774af_caseD_c:
            if (uVar20 < 0x100) goto LAB_00177505;
            break;
          case 0x11:
          case 0x15:
          case 0x17:
          case 0x19:
            if (uVar20 - 10 < 4) {
              return 0;
            }
            if (uVar20 - 0x2028 < 2) {
              return 0;
            }
            if (uVar20 == 0x85) {
              return 0;
            }
            break;
          case 0x12:
            if (((10 < uVar20 - 0x2000) && (uVar20 != 9)) &&
               (((uVar20 != 0x20 &&
                 ((((uVar20 != 0xa0 && (uVar20 != 0x1680)) && (uVar20 != 0x180e)) &&
                  ((uVar20 != 0x202f && (uVar20 != 0x205f)))))) && (uVar20 != 0x3000)))) {
              return 0;
            }
            break;
          case 0x13:
            if (uVar20 - 0x2000 < 0xb) {
              return 0;
            }
            if (uVar20 == 9) {
              return 0;
            }
            if (uVar20 == 0x20) {
              return 0;
            }
            if (uVar20 == 0xa0) {
              return 0;
            }
            if (uVar20 == 0x1680) {
              return 0;
            }
            if (uVar20 == 0x180e) {
              return 0;
            }
            if (uVar20 == 0x202f) {
              return 0;
            }
            if (uVar20 == 0x205f) {
              return 0;
            }
            if (uVar20 == 0x3000) {
              return 0;
            }
            break;
          case 0x14:
            if (((3 < uVar20 - 10) && (1 < uVar20 - 0x2028)) && (uVar20 != 0x85)) {
              return 0;
            }
            break;
          case 0x18:
            break;
          case 0x1d:
            uVar21 = *(uint *)ppuVar18;
            pcVar14 = pcVar17;
            do {
              if (uVar20 == uVar21) {
                return 0;
              }
              uVar21 = *(uint *)&pcVar14->cx;
              pcVar14 = (compile_block_8 *)((long)&pcVar14->cx + 4);
            } while (uVar21 != 0xffffffff);
            break;
          case 0x1f:
            uVar21 = *(uint *)ppuVar18;
            pcVar14 = pcVar17;
            while (uVar20 != uVar21) {
              uVar21 = *(uint *)&pcVar14->cx;
              pcVar14 = (compile_block_8 *)((long)&pcVar14->cx + 4);
              if (uVar21 == 0xffffffff) {
                return 0;
              }
            }
            if (uVar20 == 0xffffffff) {
              return 0;
            }
          }
switchD_001774af_caseD_18:
          uVar20 = *(uint *)((long)ppuVar19 + 4);
          ppuVar19 = (uint8_t **)((long)ppuVar19 + 4);
        } while (uVar20 != 0xffffffff);
      }
      else {
        if (list[0] == 0x1d) {
          ppuVar19 = (uint8_t **)(list + 2);
          pcVar17 = cb;
          ppuVar18 = ppuVar1;
          goto LAB_00177471;
        }
        if ((list[0] != 0x6e && uVar8 != 0x6e) && ((utf != 0 || (uVar8 != 0x6f && list[0] != 0x6f)))
           ) {
          if (0x10 < uVar8 - 6) {
            return 0;
          }
          if (0x14 < list[0] - 6) {
            return 0;
          }
          fcc = (compile_block_8 *)(ulong)(list[0] - 6);
          if (*(uint8_t *)
               ((long)fcc->small_ref_offset + (long)((autoposstab + (uVar8 - 6))[-5] + 0x11)) ==
              '\0') {
            return 0;
          }
          goto LAB_001778ce;
        }
        if ((uVar8 == 0x6e) ||
           (puVar11 = (uint32_t *)code, ppuVar19 = ppuVar1, pcVar17 = cb, uVar20 = list[2],
           uVar8 == 0x6f && utf == 0)) {
          puVar11 = base_list;
          ppuVar19 = (uint8_t **)(list + 2);
          pcVar17 = (compile_block_8 *)list;
          uVar20 = *(uint *)ppuVar1;
          uVar8 = list[0];
        }
        bVar5 = false;
        switch(uVar8) {
        case 6:
          bVar5 = true;
        case 7:
          lVar13 = *(long *)(lVar16 + 0x18) + 0x40;
          break;
        case 8:
          bVar5 = true;
        case 9:
          lVar13 = *(long *)(lVar16 + 0x18);
          break;
        case 10:
          bVar5 = true;
        case 0xb:
          lVar13 = *(long *)(lVar16 + 0x18) + 0xa0;
          break;
        default:
          if (1 < uVar8 - 0x6e) {
            return 0;
          }
          puVar12 = (uint32_t *)code;
          if (pcVar17 != (compile_block_8 *)list) {
            puVar12 = base_list;
          }
          lVar13 = (long)puVar12 - (ulong)*(uint *)ppuVar19;
          goto LAB_001778b7;
        }
        if (bVar5) {
          lVar15 = 0;
          do {
            if ((~*(byte *)(lVar13 + lVar15) & *(byte *)(((long)puVar11 - (ulong)uVar20) + lVar15))
                != 0) {
              return 0;
            }
            lVar15 = lVar15 + 1;
          } while (lVar15 != 0x20);
          fcc = (compile_block_8 *)0x20;
        }
        else {
LAB_001778b7:
          fcc = (compile_block_8 *)0x0;
          do {
            if ((*(byte *)(((long)puVar11 - (ulong)uVar20) + (long)fcc) &
                *(byte *)((long)fcc->small_ref_offset + lVar13 + -0x58)) != 0) {
              return 0;
            }
            fcc = (compile_block_8 *)((long)&fcc->cx + 1);
          } while (fcc != (compile_block_8 *)0x20);
        }
      }
LAB_001778ce:
      if (list[1] == 0) {
        return 1;
      }
    }
    fcc = (compile_block_8 *)0x15000;
    if ((0x15000U >> (uVar8 & 0x1f) & 1) == 0) {
      if ((9U >> (uVar8 & 0x1f) & 1) == 0) {
        fcc = (compile_block_8 *)0xc0000000;
        if ((0xc0000000U >> (uVar8 & 0x1f) & 1) == 0) goto LAB_00177410;
        uVar8 = *(byte *)((long)puVar11 + 1) - 0x85;
        if (4 < uVar8) {
          return 0;
        }
        if ((0x15U >> (uVar8 & 0x1f) & 1) == 0) {
          return 0;
        }
        pbVar22 = (byte *)((long)puVar11 + 1);
        do {
          uVar7 = *(ushort *)(pbVar22 + 1) << 8 | *(ushort *)(pbVar22 + 1) >> 8;
          pbVar2 = pbVar22 + uVar7;
          pbVar22 = pbVar22 + uVar7;
        } while (*pbVar2 == 0x78);
        fcc = cb;
        pcVar17 = (compile_block_8 *)base_list;
        BVar9 = compare_opcodes(pbVar22 + 3,utf,ucp,cb,base_list,base_end,
                                (int *)CONCAT44(utf,in_stack_ffffffffffffff88));
        if (BVar9 == 0) {
          return 0;
        }
      }
      else {
        if (*(int *)((long)&cb->cx + 4) == 0) {
          return 0;
        }
        uVar10 = (ulong)(ushort)(*(ushort *)((long)puVar11 + 1) << 8 |
                                *(ushort *)((long)puVar11 + 1) >> 8);
        uVar8 = *(byte *)((long)puVar11 - uVar10) - 0x7f;
        pcVar14 = (compile_block_8 *)(ulong)uVar8;
        fcc = pcVar14;
        if (uVar8 < 0x11) {
          fcc = (compile_block_8 *)
                ((long)&switchD_001773ec::switchdataD_001a2a8c +
                (long)(int)(&switchD_001773ec::switchdataD_001a2a8c)[(long)pcVar14]);
          switch(pcVar14) {
          case (compile_block_8 *)0x0:
          case (compile_block_8 *)0x1:
          case (compile_block_8 *)0x6:
            return (uint)!bVar6;
          case (compile_block_8 *)0x2:
          case (compile_block_8 *)0x3:
            return (uint)(!bVar6 && *(byte *)((long)puVar11 + (3 - uVar10)) != 0x7e);
          case (compile_block_8 *)0x4:
          case (compile_block_8 *)0x5:
            goto LAB_00177947;
          case (compile_block_8 *)0x7:
            if (1 < *(int *)&cb->cx - 0x1dU) {
              return 0;
            }
            break;
          case (compile_block_8 *)0xa:
          case (compile_block_8 *)0xb:
          case (compile_block_8 *)0xf:
          case (compile_block_8 *)0x10:
            if (*(int *)(lVar16 + 0x120) != 0) {
              return 0;
            }
          }
        }
      }
      code = (PCRE2_SPTR8)
             ((long)puVar11 +
             (ulong)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x03\x03\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x01\x01\x01\x01\x01\x01\x05\x05\x01\x01\x01\x05!!"
                    [bVar3]);
      goto LAB_001772c6;
    }
    code = (PCRE2_SPTR8)
           ((long)puVar11 +
           (ulong)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x03\x03\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x01\x01\x01\x01\x01\x01\x05\x05\x01\x01\x01\x05!!"
                  [bVar3]);
    for (pbVar22 = (byte *)((ulong)(ushort)(*(ushort *)((long)puVar11 + 1) << 8 |
                                           *(ushort *)((long)puVar11 + 1) >> 8) + (long)puVar11);
        *pbVar22 == 0x78;
        pbVar22 = pbVar22 + (ushort)(*(ushort *)(pbVar22 + 1) << 8 | *(ushort *)(pbVar22 + 1) >> 8))
    {
      fcc = cb;
      pcVar17 = (compile_block_8 *)base_list;
      BVar9 = compare_opcodes(code,utf,ucp,cb,base_list,base_end,
                              (int *)CONCAT44(utf,in_stack_ffffffffffffff88));
      if (BVar9 == 0) {
LAB_00177947:
        return 0;
      }
      code = pbVar22 + 3;
    }
    bVar6 = true;
  } while( true );
}

Assistant:

static BOOL
compare_opcodes(PCRE2_SPTR code, BOOL utf, BOOL ucp, const compile_block *cb,
  const uint32_t *base_list, PCRE2_SPTR base_end, int *rec_limit)
{
PCRE2_UCHAR c;
uint32_t list[8];
const uint32_t *chr_ptr;
const uint32_t *ochr_ptr;
const uint32_t *list_ptr;
PCRE2_SPTR next_code;
#ifdef SUPPORT_WIDE_CHARS
PCRE2_SPTR xclass_flags;
#endif
const uint8_t *class_bitset;
const uint8_t *set1, *set2, *set_end;
uint32_t chr;
BOOL accepted, invert_bits;
BOOL entered_a_group = FALSE;

if (--(*rec_limit) <= 0) return FALSE;  /* Recursion has gone too deep */

/* Note: the base_list[1] contains whether the current opcode has a greedy
(represented by a non-zero value) quantifier. This is a different from
other character type lists, which store here that the character iterator
matches to an empty string (also represented by a non-zero value). */

for(;;)
  {
  PCRE2_SPTR bracode;

  /* All operations move the code pointer forward.
  Therefore infinite recursions are not possible. */

  c = *code;

  /* Skip over callouts */

  if (c == OP_CALLOUT)
    {
    code += PRIV(OP_lengths)[c];
    continue;
    }

  if (c == OP_CALLOUT_STR)
    {
    code += GET(code, 1 + 2*LINK_SIZE);
    continue;
    }

  /* At the end of a branch, skip to the end of the group. */

  if (c == OP_ALT)
    {
    do code += GET(code, 1); while (*code == OP_ALT);
    c = *code;
    }

  /* Inspect the next opcode. */

  switch(c)
    {
    /* We can always possessify a greedy iterator at the end of the pattern,
    which is reached after skipping over the final OP_KET. A non-greedy
    iterator must never be possessified. */

    case OP_END:
    return base_list[1] != 0;

    /* When an iterator is at the end of certain kinds of group we can inspect
    what follows the group by skipping over the closing ket. Note that this
    does not apply to OP_KETRMAX or OP_KETRMIN because what follows any given
    iteration is variable (could be another iteration or could be the next
    item). As these two opcodes are not listed in the next switch, they will
    end up as the next code to inspect, and return FALSE by virtue of being
    unsupported. */

    case OP_KET:
    case OP_KETRPOS:
    /* The non-greedy case cannot be converted to a possessive form. */

    if (base_list[1] == 0) return FALSE;

    /* If the bracket is capturing it might be referenced by an OP_RECURSE
    so its last iterator can never be possessified if the pattern contains
    recursions. (This could be improved by keeping a list of group numbers that
    are called by recursion.) */

    bracode = code - GET(code, 1);
    switch(*bracode)
      {
      case OP_CBRA:
      case OP_SCBRA:
      case OP_CBRAPOS:
      case OP_SCBRAPOS:
      if (cb->had_recurse) return FALSE;
      break;

      /* A script run might have to backtrack if the iterated item can match
      characters from more than one script. So give up unless repeating an
      explicit character. */

      case OP_SCRIPT_RUN:
      if (base_list[0] != OP_CHAR && base_list[0] != OP_CHARI)
        return FALSE;
      break;

      /* Atomic sub-patterns and assertions can always auto-possessify their
      last iterator except for variable length lookbehinds. However, if the
      group was entered as a result of checking a previous iterator, this is
      not possible. */

      case OP_ASSERT:
      case OP_ASSERT_NOT:
      case OP_ONCE:
      return !entered_a_group;

      case OP_ASSERTBACK:
      case OP_ASSERTBACK_NOT:
      return (bracode[1+LINK_SIZE] == OP_VREVERSE)? FALSE : !entered_a_group;

      /* Non-atomic assertions - don't possessify last iterator. This needs
      more thought. */

      case OP_ASSERT_NA:
      case OP_ASSERTBACK_NA:
      return FALSE;
      }

    /* Skip over the bracket and inspect what comes next. */

    code += PRIV(OP_lengths)[c];
    continue;

    /* Handle cases where the next item is a group. */

    case OP_ONCE:
    case OP_BRA:
    case OP_CBRA:
    next_code = code + GET(code, 1);
    code += PRIV(OP_lengths)[c];

    /* Check each branch. We have to recurse a level for all but the last
    branch. */

    while (*next_code == OP_ALT)
      {
      if (!compare_opcodes(code, utf, ucp, cb, base_list, base_end, rec_limit))
        return FALSE;
      code = next_code + 1 + LINK_SIZE;
      next_code += GET(next_code, 1);
      }

    entered_a_group = TRUE;
    continue;

    case OP_BRAZERO:
    case OP_BRAMINZERO:

    next_code = code + 1;
    if (*next_code != OP_BRA && *next_code != OP_CBRA &&
        *next_code != OP_ONCE) return FALSE;

    do next_code += GET(next_code, 1); while (*next_code == OP_ALT);

    /* The bracket content will be checked by the OP_BRA/OP_CBRA case above. */

    next_code += 1 + LINK_SIZE;
    if (!compare_opcodes(next_code, utf, ucp, cb, base_list, base_end,
         rec_limit))
      return FALSE;

    code += PRIV(OP_lengths)[c];
    continue;

    /* The next opcode does not need special handling; fall through and use it
    to see if the base can be possessified. */

    default:
    break;
    }

  /* We now have the next appropriate opcode to compare with the base. Check
  for a supported opcode, and load its properties. */

  code = get_chr_property_list(code, utf, ucp, cb->fcc, list);
  if (code == NULL) return FALSE;    /* Unsupported */

  /* If either opcode is a small character list, set pointers for comparing
  characters from that list with another list, or with a property. */

  if (base_list[0] == OP_CHAR)
    {
    chr_ptr = base_list + 2;
    list_ptr = list;
    }
  else if (list[0] == OP_CHAR)
    {
    chr_ptr = list + 2;
    list_ptr = base_list;
    }

  /* Character bitsets can also be compared to certain opcodes. */

  else if (base_list[0] == OP_CLASS || list[0] == OP_CLASS
#if PCRE2_CODE_UNIT_WIDTH == 8
      /* In 8 bit, non-UTF mode, OP_CLASS and OP_NCLASS are the same. */
      || (!utf && (base_list[0] == OP_NCLASS || list[0] == OP_NCLASS))
#endif
      )
    {
#if PCRE2_CODE_UNIT_WIDTH == 8
    if (base_list[0] == OP_CLASS || (!utf && base_list[0] == OP_NCLASS))
#else
    if (base_list[0] == OP_CLASS)
#endif
      {
      set1 = (uint8_t *)(base_end - base_list[2]);
      list_ptr = list;
      }
    else
      {
      set1 = (uint8_t *)(code - list[2]);
      list_ptr = base_list;
      }

    invert_bits = FALSE;
    switch(list_ptr[0])
      {
      case OP_CLASS:
      case OP_NCLASS:
      set2 = (uint8_t *)
        ((list_ptr == list ? code : base_end) - list_ptr[2]);
      break;

#ifdef SUPPORT_WIDE_CHARS
      case OP_XCLASS:
      xclass_flags = (list_ptr == list ? code : base_end) - list_ptr[2] + LINK_SIZE;
      if ((*xclass_flags & XCL_HASPROP) != 0) return FALSE;
      if ((*xclass_flags & XCL_MAP) == 0)
        {
        /* No bits are set for characters < 256. */
        if (list[1] == 0) return (*xclass_flags & XCL_NOT) == 0;
        /* Might be an empty repeat. */
        continue;
        }
      set2 = (uint8_t *)(xclass_flags + 1);
      break;
#endif

      case OP_NOT_DIGIT:
      invert_bits = TRUE;
      /* Fall through */
      case OP_DIGIT:
      set2 = (uint8_t *)(cb->cbits + cbit_digit);
      break;

      case OP_NOT_WHITESPACE:
      invert_bits = TRUE;
      /* Fall through */
      case OP_WHITESPACE:
      set2 = (uint8_t *)(cb->cbits + cbit_space);
      break;

      case OP_NOT_WORDCHAR:
      invert_bits = TRUE;
      /* Fall through */
      case OP_WORDCHAR:
      set2 = (uint8_t *)(cb->cbits + cbit_word);
      break;

      default:
      return FALSE;
      }

    /* Because the bit sets are unaligned bytes, we need to perform byte
    comparison here. */

    set_end = set1 + 32;
    if (invert_bits)
      {
      do
        {
        if ((*set1++ & ~(*set2++)) != 0) return FALSE;
        }
      while (set1 < set_end);
      }
    else
      {
      do
        {
        if ((*set1++ & *set2++) != 0) return FALSE;
        }
      while (set1 < set_end);
      }

    if (list[1] == 0) return TRUE;
    /* Might be an empty repeat. */
    continue;
    }

  /* Some property combinations also acceptable. Unicode property opcodes are
  processed specially; the rest can be handled with a lookup table. */

  else
    {
    uint32_t leftop, rightop;

    leftop = base_list[0];
    rightop = list[0];

#ifdef SUPPORT_UNICODE
    accepted = FALSE; /* Always set in non-unicode case. */
    if (leftop == OP_PROP || leftop == OP_NOTPROP)
      {
      if (rightop == OP_EOD)
        accepted = TRUE;
      else if (rightop == OP_PROP || rightop == OP_NOTPROP)
        {
        int n;
        const uint8_t *p;
        BOOL same = leftop == rightop;
        BOOL lisprop = leftop == OP_PROP;
        BOOL risprop = rightop == OP_PROP;
        BOOL bothprop = lisprop && risprop;

        /* There's a table that specifies how each combination is to be
        processed:
          0   Always return FALSE (never auto-possessify)
          1   Character groups are distinct (possessify if both are OP_PROP)
          2   Check character categories in the same group (general or particular)
          3   Return TRUE if the two opcodes are not the same
          ... see comments below
        */

        n = propposstab[base_list[2]][list[2]];
        switch(n)
          {
          case 0: break;
          case 1: accepted = bothprop; break;
          case 2: accepted = (base_list[3] == list[3]) != same; break;
          case 3: accepted = !same; break;

          case 4:  /* Left general category, right particular category */
          accepted = risprop && catposstab[base_list[3]][list[3]] == same;
          break;

          case 5:  /* Right general category, left particular category */
          accepted = lisprop && catposstab[list[3]][base_list[3]] == same;
          break;

          /* This code is logically tricky. Think hard before fiddling with it.
          The posspropstab table has four entries per row. Each row relates to
          one of PCRE's special properties such as ALNUM or SPACE or WORD.
          Only WORD actually needs all four entries, but using repeats for the
          others means they can all use the same code below.

          The first two entries in each row are Unicode general categories, and
          apply always, because all the characters they include are part of the
          PCRE character set. The third and fourth entries are a general and a
          particular category, respectively, that include one or more relevant
          characters. One or the other is used, depending on whether the check
          is for a general or a particular category. However, in both cases the
          category contains more characters than the specials that are defined
          for the property being tested against. Therefore, it cannot be used
          in a NOTPROP case.

          Example: the row for WORD contains ucp_L, ucp_N, ucp_P, ucp_Po.
          Underscore is covered by ucp_P or ucp_Po. */

          case 6:  /* Left alphanum vs right general category */
          case 7:  /* Left space vs right general category */
          case 8:  /* Left word vs right general category */
          p = posspropstab[n-6];
          accepted = risprop && lisprop ==
            (list[3] != p[0] &&
             list[3] != p[1] &&
            (list[3] != p[2] || !lisprop));
          break;

          case 9:   /* Right alphanum vs left general category */
          case 10:  /* Right space vs left general category */
          case 11:  /* Right word vs left general category */
          p = posspropstab[n-9];
          accepted = lisprop && risprop ==
            (base_list[3] != p[0] &&
             base_list[3] != p[1] &&
            (base_list[3] != p[2] || !risprop));
          break;

          case 12:  /* Left alphanum vs right particular category */
          case 13:  /* Left space vs right particular category */
          case 14:  /* Left word vs right particular category */
          p = posspropstab[n-12];
          accepted = risprop && lisprop ==
            (catposstab[p[0]][list[3]] &&
             catposstab[p[1]][list[3]] &&
            (list[3] != p[3] || !lisprop));
          break;

          case 15:  /* Right alphanum vs left particular category */
          case 16:  /* Right space vs left particular category */
          case 17:  /* Right word vs left particular category */
          p = posspropstab[n-15];
          accepted = lisprop && risprop ==
            (catposstab[p[0]][base_list[3]] &&
             catposstab[p[1]][base_list[3]] &&
            (base_list[3] != p[3] || !risprop));
          break;
          }
        }
      }

    else
#endif  /* SUPPORT_UNICODE */

    accepted = leftop >= FIRST_AUTOTAB_OP && leftop <= LAST_AUTOTAB_LEFT_OP &&
           rightop >= FIRST_AUTOTAB_OP && rightop <= LAST_AUTOTAB_RIGHT_OP &&
           autoposstab[leftop - FIRST_AUTOTAB_OP][rightop - FIRST_AUTOTAB_OP];

    if (!accepted) return FALSE;

    if (list[1] == 0) return TRUE;
    /* Might be an empty repeat. */
    continue;
    }

  /* Control reaches here only if one of the items is a small character list.
  All characters are checked against the other side. */

  do
    {
    chr = *chr_ptr;

    switch(list_ptr[0])
      {
      case OP_CHAR:
      ochr_ptr = list_ptr + 2;
      do
        {
        if (chr == *ochr_ptr) return FALSE;
        ochr_ptr++;
        }
      while(*ochr_ptr != NOTACHAR);
      break;

      case OP_NOT:
      ochr_ptr = list_ptr + 2;
      do
        {
        if (chr == *ochr_ptr)
          break;
        ochr_ptr++;
        }
      while(*ochr_ptr != NOTACHAR);
      if (*ochr_ptr == NOTACHAR) return FALSE;   /* Not found */
      break;

      /* Note that OP_DIGIT etc. are generated only when PCRE2_UCP is *not*
      set. When it is set, \d etc. are converted into OP_(NOT_)PROP codes. */

      case OP_DIGIT:
      if (chr < 256 && (cb->ctypes[chr] & ctype_digit) != 0) return FALSE;
      break;

      case OP_NOT_DIGIT:
      if (chr > 255 || (cb->ctypes[chr] & ctype_digit) == 0) return FALSE;
      break;

      case OP_WHITESPACE:
      if (chr < 256 && (cb->ctypes[chr] & ctype_space) != 0) return FALSE;
      break;

      case OP_NOT_WHITESPACE:
      if (chr > 255 || (cb->ctypes[chr] & ctype_space) == 0) return FALSE;
      break;

      case OP_WORDCHAR:
      if (chr < 255 && (cb->ctypes[chr] & ctype_word) != 0) return FALSE;
      break;

      case OP_NOT_WORDCHAR:
      if (chr > 255 || (cb->ctypes[chr] & ctype_word) == 0) return FALSE;
      break;

      case OP_HSPACE:
      switch(chr)
        {
        HSPACE_CASES: return FALSE;
        default: break;
        }
      break;

      case OP_NOT_HSPACE:
      switch(chr)
        {
        HSPACE_CASES: break;
        default: return FALSE;
        }
      break;

      case OP_ANYNL:
      case OP_VSPACE:
      switch(chr)
        {
        VSPACE_CASES: return FALSE;
        default: break;
        }
      break;

      case OP_NOT_VSPACE:
      switch(chr)
        {
        VSPACE_CASES: break;
        default: return FALSE;
        }
      break;

      case OP_DOLL:
      case OP_EODN:
      switch (chr)
        {
        case CHAR_CR:
        case CHAR_LF:
        case CHAR_VT:
        case CHAR_FF:
        case CHAR_NEL:
#ifndef EBCDIC
        case 0x2028:
        case 0x2029:
#endif  /* Not EBCDIC */
        return FALSE;
        }
      break;

      case OP_EOD:    /* Can always possessify before \z */
      break;

#ifdef SUPPORT_UNICODE
      case OP_PROP:
      case OP_NOTPROP:
      if (!check_char_prop(chr, list_ptr[2], list_ptr[3],
            list_ptr[0] == OP_NOTPROP))
        return FALSE;
      break;
#endif

      case OP_NCLASS:
      if (chr > 255) return FALSE;
      /* Fall through */

      case OP_CLASS:
      if (chr > 255) break;
      class_bitset = (uint8_t *)
        ((list_ptr == list ? code : base_end) - list_ptr[2]);
      if ((class_bitset[chr >> 3] & (1u << (chr & 7))) != 0) return FALSE;
      break;

#ifdef SUPPORT_WIDE_CHARS
      case OP_XCLASS:
      if (PRIV(xclass)(chr, (list_ptr == list ? code : base_end) -
          list_ptr[2] + LINK_SIZE, utf)) return FALSE;
      break;
#endif

      default:
      return FALSE;
      }

    chr_ptr++;
    }
  while(*chr_ptr != NOTACHAR);

  /* At least one character must be matched from this opcode. */

  if (list[1] == 0) return TRUE;
  }

/* Control never reaches here. There used to be a fail-save return FALSE; here,
but some compilers complain about an unreachable statement. */
}